

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O1

ostream * __thiscall
tchecker::parsing::edge_declaration_t::output(edge_declaration_t *this,ostream *os)

{
  element_type *peVar1;
  element_type *peVar2;
  element_type *peVar3;
  ostream *poVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"edge:",5);
  peVar1 = (this->_process).
           super___shared_ptr<const_tchecker::parsing::process_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(peVar1->_name)._M_dataplus._M_p,(peVar1->_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  peVar2 = (this->_src).
           super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(peVar2->_name)._M_dataplus._M_p,(peVar2->_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  peVar2 = (this->_tgt).
           super___shared_ptr<const_tchecker::parsing::location_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(peVar2->_name)._M_dataplus._M_p,(peVar2->_name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
  peVar3 = (this->_event).
           super___shared_ptr<const_tchecker::parsing::event_declaration_t,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,(peVar3->_name)._M_dataplus._M_p,(peVar3->_name)._M_string_length);
  poVar4 = parsing::operator<<(poVar4,&(this->super_inner_declaration_t).super_declaration_t._attr);
  return poVar4;
}

Assistant:

std::ostream & edge_declaration_t::output(std::ostream & os) const
{
  return os << "edge:" << _process->name() << ":" << _src->name() << ":" << _tgt->name() << ":" << _event->name() << _attr;
}